

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O0

void fdct32_sse4_1(__m128i *input,__m128i *output,int8_t cos_bit,int8_t *stage_range)

{
  int col;
  int col_num;
  int num_per_128;
  int txfm_size;
  int in_stack_00001038;
  int in_stack_0000103c;
  __m128i *in_stack_00001040;
  __m128i *in_stack_00001048;
  undefined4 local_30;
  
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    av1_fdct32_sse4_1(in_stack_00001048,in_stack_00001040,in_stack_0000103c,in_stack_00001038);
  }
  return;
}

Assistant:

static void fdct32_sse4_1(__m128i *input, __m128i *output, const int8_t cos_bit,
                          const int8_t *stage_range) {
  const int txfm_size = 32;
  const int num_per_128 = 4;
  int col_num = txfm_size / num_per_128;
  int col;
  (void)stage_range;
  for (col = 0; col < col_num; col++) {
    av1_fdct32_sse4_1((input + col), (output + col), cos_bit, col_num);
  }
}